

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMini.c
# Opt level: O0

Gia_Man_t * Gia_MiniAigReduce(Mini_Aig_t *p,int *pEquivs)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  Vec_Int_t *p_01;
  Gia_Man_t *pGVar5;
  int local_38;
  int nNodes;
  int iGiaLit;
  int i;
  Vec_Int_t *vCopies;
  Gia_Man_t *pTemp;
  Gia_Man_t *pGia;
  int *pEquivs_local;
  Mini_Aig_t *p_local;
  
  iVar1 = Mini_AigNodeNum(p);
  p_00 = Gia_ManStart(iVar1);
  pcVar4 = Abc_UtilStrsav("MiniAig");
  p_00->pName = pcVar4;
  p_01 = Vec_IntAlloc(iVar1);
  Vec_IntPush(p_01,0);
  Gia_ManHashAlloc(p_00);
  nNodes = 1;
  do {
    if (iVar1 <= nNodes) {
      Gia_ManHashStop(p_00);
      iVar2 = Vec_IntSize(p_01);
      if (iVar2 != iVar1) {
        __assert_fail("Vec_IntSize(vCopies) == nNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                      ,0x2c5,"Gia_Man_t *Gia_MiniAigReduce(Mini_Aig_t *, int *)");
      }
      Vec_IntFree(p_01);
      iVar1 = Mini_AigRegNum(p);
      Gia_ManSetRegNum(p_00,iVar1);
      pGVar5 = Gia_ManSeqCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar5;
    }
    iVar2 = Mini_AigNodeIsPi(p,nNodes);
    if (iVar2 == 0) {
      iVar2 = Mini_AigNodeIsPo(p,nNodes);
      if (iVar2 == 0) {
        iVar2 = Mini_AigNodeIsAnd(p,nNodes);
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaMini.c"
                        ,0x2bf,"Gia_Man_t *Gia_MiniAigReduce(Mini_Aig_t *, int *)");
        }
        iVar2 = Gia_ObjFromMiniFanin0Copy(p_00,p_01,p,nNodes);
        iVar3 = Gia_ObjFromMiniFanin1Copy(p_00,p_01,p,nNodes);
        local_38 = Gia_ManHashAnd(p_00,iVar2,iVar3);
      }
      else {
        iVar2 = Gia_ObjFromMiniFanin0Copy(p_00,p_01,p,nNodes);
        local_38 = Gia_ManAppendCo(p_00,iVar2);
      }
    }
    else {
      local_38 = Gia_ManAppendCi(p_00);
    }
    if (pEquivs[nNodes] != -1) {
      iVar2 = Abc_Lit2Var(pEquivs[nNodes]);
      iVar2 = Vec_IntEntry(p_01,iVar2);
      iVar3 = Abc_LitIsCompl(pEquivs[nNodes]);
      local_38 = Abc_LitNotCond(iVar2,iVar3);
    }
    Vec_IntPush(p_01,local_38);
    nNodes = nNodes + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_MiniAigReduce( Mini_Aig_t * p, int * pEquivs )
{
    Gia_Man_t * pGia, * pTemp;
    Vec_Int_t * vCopies;
    int i, iGiaLit = 0, nNodes;
    // get the number of nodes
    nNodes = Mini_AigNodeNum(p);
    // create ABC network
    pGia = Gia_ManStart( nNodes );
    pGia->pName = Abc_UtilStrsav( "MiniAig" );
    // create mapping from MiniAIG objects into ABC objects
    vCopies = Vec_IntAlloc( nNodes );
    Vec_IntPush( vCopies, 0 );
    // iterate through the objects
    Gia_ManHashAlloc( pGia );
    for ( i = 1; i < nNodes; i++ )
    {
        if ( Mini_AigNodeIsPi( p, i ) )
            iGiaLit = Gia_ManAppendCi(pGia);
        else if ( Mini_AigNodeIsPo( p, i ) )
            iGiaLit = Gia_ManAppendCo(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i));
        else if ( Mini_AigNodeIsAnd( p, i ) )
            iGiaLit = Gia_ManHashAnd(pGia, Gia_ObjFromMiniFanin0Copy(pGia, vCopies, p, i), Gia_ObjFromMiniFanin1Copy(pGia, vCopies, p, i));
        else assert( 0 );
        if ( pEquivs[i] != -1 )
            iGiaLit = Abc_LitNotCond( Vec_IntEntry(vCopies, Abc_Lit2Var(pEquivs[i])), Abc_LitIsCompl(pEquivs[i]) );
        Vec_IntPush( vCopies, iGiaLit );
    }
    Gia_ManHashStop( pGia );
    assert( Vec_IntSize(vCopies) == nNodes );
    Vec_IntFree( vCopies );
    Gia_ManSetRegNum( pGia, Mini_AigRegNum(p) );
    pGia = Gia_ManSeqCleanup( pTemp = pGia );
    Gia_ManStop( pTemp );
    return pGia;
}